

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_SetLineBlocking(FParser *this)

{
  ushort uVar1;
  uint uVar2;
  FLineIdIterator itr;
  FLineIdIterator local_28;
  
  if (1 < this->t_argc) {
    uVar2 = intvalue(this->t_argv + 1);
    if (uVar2 < 3) {
      uVar1 = SF_SetLineBlocking::blocks[uVar2];
      local_28.searchtag = intvalue(this->t_argv);
      local_28.start = tagManager.IDHashFirst[local_28.searchtag & 0xff];
      uVar2 = FLineIdIterator::Next(&local_28);
      while (-1 < (int)uVar2) {
        lines[uVar2].flags = lines[uVar2].flags & 0xffff7ffe | (uint)uVar1;
        uVar2 = FLineIdIterator::Next(&local_28);
      }
    }
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void FParser::SF_SetLineBlocking(void)
{
	static unsigned short blocks[]={0,ML_BLOCKING,ML_BLOCKEVERYTHING};
	
	if (CheckArgs(2))
	{
		int blocking=intvalue(t_argv[1]);
		if (blocking>=0 && blocking<=2) 
		{
			blocking=blocks[blocking];
			int tag=intvalue(t_argv[0]);
			FLineIdIterator itr(tag);
			int i;
			while ((i = itr.Next()) >= 0)
			{
				lines[i].flags = (lines[i].flags & ~(ML_BLOCKING | ML_BLOCKEVERYTHING)) | blocking;
			}
		}
	}
}